

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::FieldOptions::SerializeWithCachedSizesToArray(FieldOptions *this,uint8 *target)

{
  bool bVar1;
  string *psVar2;
  UninterpretedOption *this_00;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar3;
  uint uVar4;
  uint32 value;
  long lVar5;
  uint8 *puVar6;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    uVar4 = this->ctype_;
    *target = '\b';
    if ((long)(int)uVar4 < 0) {
      target = io::CodedOutputStream::WriteVarint64ToArray((long)(int)uVar4,target + 1);
    }
    else if (uVar4 < 0x80) {
      target[1] = (uint8)uVar4;
      target = target + 2;
    }
    else {
      target = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar4,target + 1);
    }
  }
  uVar4 = this->_has_bits_[0];
  if ((uVar4 & 2) != 0) {
    bVar1 = this->packed_;
    *target = '\x10';
    target[1] = bVar1;
    target = target + 2;
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 8) != 0) {
    bVar1 = this->deprecated_;
    *target = '\x18';
    target[1] = bVar1;
    target = target + 2;
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 4) != 0) {
    bVar1 = this->lazy_;
    *target = '(';
    target[1] = bVar1;
    target = target + 2;
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 0x10) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->experimental_map_key_->_M_dataplus)._M_p,
               (int)this->experimental_map_key_->_M_string_length,SERIALIZE);
    psVar2 = this->experimental_map_key_;
    *target = 'J';
    value = (uint32)psVar2->_M_string_length;
    if (value < 0x80) {
      target[1] = (uint8)psVar2->_M_string_length;
      puVar6 = target + 2;
    }
    else {
      puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(value,target + 1);
    }
    target = io::CodedOutputStream::WriteRawToArray
                       ((psVar2->_M_dataplus)._M_p,(int)psVar2->_M_string_length,puVar6);
    uVar4 = this->_has_bits_[0];
  }
  if ((uVar4 & 0x20) != 0) {
    bVar1 = this->weak_;
    *target = 'P';
    target[1] = bVar1;
    target = target + 2;
  }
  if (0 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
    lVar5 = 0;
    do {
      this_00 = (UninterpretedOption *)
                (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar5];
      target[0] = 0xba;
      target[1] = '>';
      uVar4 = this_00->_cached_size_;
      if (uVar4 < 0x80) {
        target[2] = (uint8)uVar4;
        puVar6 = target + 3;
      }
      else {
        puVar6 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar4,target + 2);
      }
      target = UninterpretedOption::SerializeWithCachedSizesToArray(this_00,puVar6);
      lVar5 = lVar5 + 1;
    } while (lVar5 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  puVar6 = internal::ExtensionSet::SerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,target);
  pvVar3 = (this->_unknown_fields_).fields_;
  if ((pvVar3 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar3->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar6 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,puVar6);
    return puVar6;
  }
  return puVar6;
}

Assistant:

::google::protobuf::uint8* FieldOptions::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
  if (has_ctype()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->ctype(), target);
  }

  // optional bool packed = 2;
  if (has_packed()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->packed(), target);
  }

  // optional bool deprecated = 3 [default = false];
  if (has_deprecated()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(3, this->deprecated(), target);
  }

  // optional bool lazy = 5 [default = false];
  if (has_lazy()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(5, this->lazy(), target);
  }

  // optional string experimental_map_key = 9;
  if (has_experimental_map_key()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->experimental_map_key().data(), this->experimental_map_key().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        9, this->experimental_map_key(), target);
  }

  // optional bool weak = 10 [default = false];
  if (has_weak()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(10, this->weak(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.SerializeWithCachedSizesToArray(
      1000, 536870912, target);

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}